

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCU.cpp
# Opt level: O0

void __thiscall kpeg::MCU::performLevelShift(MCU *this)

{
  Level LVar1;
  Logger *pLVar2;
  reference pvVar3;
  reference pvVar4;
  ostream *poVar5;
  char *pcVar6;
  void *pvVar7;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar8;
  int x;
  int y;
  int i;
  size_type in_stack_fffffffffffffea8;
  undefined2 in_stack_fffffffffffffeb0;
  undefined6 in_stack_fffffffffffffeb2;
  char *local_108;
  char *local_98;
  string local_60 [32];
  int local_40;
  int local_3c;
  int local_38;
  Level in_stack_ffffffffffffffcc;
  string local_28 [40];
  
  pLVar2 = Logger::get();
  LVar1 = Logger::getLevel(pLVar2);
  if (1 < (int)LVar1) {
    pLVar2 = Logger::get();
    poVar5 = Logger::getStream(pLVar2);
    Logger::levelStr_abi_cxx11_(in_stack_ffffffffffffffcc);
    poVar5 = std::operator<<(poVar5,local_28);
    poVar5 = std::operator<<(poVar5,"[ kpeg:");
    pcVar6 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/MCU.cpp"
                     ,0x2f);
    if (pcVar6 == (char *)0x0) {
      local_98 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/MCU.cpp"
      ;
    }
    else {
      local_98 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/MCU.cpp"
                         ,0x2f);
      local_98 = local_98 + 1;
    }
    poVar5 = std::operator<<(poVar5,local_98);
    poVar5 = std::operator<<(poVar5,":");
    pvVar7 = (void *)std::ostream::operator<<(poVar5,std::dec);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar7,0xdc);
    poVar5 = std::operator<<(poVar5," ] ");
    poVar5 = std::operator<<(poVar5,"Performing level shift on MCU: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,m_MCUCount);
    poVar5 = std::operator<<(poVar5,"...");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_28);
  }
  for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
    for (local_3c = 0; local_3c < 8; local_3c = local_3c + 1) {
      for (local_40 = 0; local_40 < 8; local_40 = local_40 + 1) {
        std::array<std::array<std::array<float,_8UL>,_8UL>,_3UL>::operator[]
                  ((array<std::array<std::array<float,_8UL>,_8UL>,_3UL> *)
                   CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),
                   in_stack_fffffffffffffea8);
        std::array<std::array<float,_8UL>,_8UL>::operator[]
                  ((array<std::array<float,_8UL>,_8UL> *)
                   CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),
                   in_stack_fffffffffffffea8);
        pvVar3 = std::array<float,_8UL>::operator[]
                           ((array<float,_8UL> *)
                            CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),
                            in_stack_fffffffffffffea8);
        in_stack_fffffffffffffea8 = SUB108((longdouble)*pvVar3,0);
        in_stack_fffffffffffffeb0 = (undefined2)((unkuint10)(longdouble)*pvVar3 >> 0x40);
        roundl();
        lVar8 = in_ST6;
        std::array<std::array<std::array<int,_8UL>,_8UL>,_3UL>::operator[]
                  ((array<std::array<std::array<int,_8UL>,_8UL>,_3UL> *)
                   CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),
                   in_stack_fffffffffffffea8);
        std::array<std::array<int,_8UL>,_8UL>::operator[]
                  ((array<std::array<int,_8UL>,_8UL> *)
                   CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),
                   in_stack_fffffffffffffea8);
        pvVar4 = std::array<int,_8UL>::operator[]
                           ((array<int,_8UL> *)
                            CONCAT62(in_stack_fffffffffffffeb2,in_stack_fffffffffffffeb0),
                            in_stack_fffffffffffffea8);
        *pvVar4 = (int)ROUND((longdouble)128.0 + in_ST0);
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = lVar8;
      }
    }
  }
  pLVar2 = Logger::get();
  LVar1 = Logger::getLevel(pLVar2);
  if (1 < (int)LVar1) {
    pLVar2 = Logger::get();
    poVar5 = Logger::getStream(pLVar2);
    Logger::levelStr_abi_cxx11_(in_stack_ffffffffffffffcc);
    poVar5 = std::operator<<(poVar5,local_60);
    poVar5 = std::operator<<(poVar5,"[ kpeg:");
    pcVar6 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/MCU.cpp"
                     ,0x2f);
    if (pcVar6 == (char *)0x0) {
      local_108 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/MCU.cpp"
      ;
    }
    else {
      local_108 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/TheIllusionistMirage[P]libKPEG/src/MCU.cpp"
                          ,0x2f);
      local_108 = local_108 + 1;
    }
    poVar5 = std::operator<<(poVar5,local_108);
    poVar5 = std::operator<<(poVar5,":");
    pvVar7 = (void *)std::ostream::operator<<(poVar5,std::dec);
    poVar5 = (ostream *)std::ostream::operator<<(pvVar7,0xf4);
    poVar5 = std::operator<<(poVar5," ] ");
    poVar5 = std::operator<<(poVar5,"Level shift on MCU: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,m_MCUCount);
    poVar5 = std::operator<<(poVar5," complete [OK]");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_60);
  }
  return;
}

Assistant:

void MCU::performLevelShift()
    {
        LOG(Logger::Level::DEBUG) << "Performing level shift on MCU: " << m_MCUCount << "..." << std::endl;
        
        for ( int i = 0; i <3; ++i )
        {
            for ( int y = 0; y < 8; ++y )
            {
                for ( int x = 0; x < 8; ++x )
                {
                    m_8x8block[i][y][x] = std::roundl( icoeffs[i][y][x] ) + 128;
                }
            }
        }
        
//         for (auto&& mat: m_8x8block )
//         {
//             for ( auto&& row : mat )
//             {
//                 for ( auto&& v : row )
//                     std::cout << v << "\t";
//                 std::cout << std::endl;
//             }
//             std::cout << std::endl;
//         }
        
        LOG(Logger::Level::DEBUG) << "Level shift on MCU: " << m_MCUCount << " complete [OK]" << std::endl;
    }